

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_estimateBlockSize_literal
                 (BYTE *literals,size_t litSize,ZSTD_hufCTables_t *huf,
                 ZSTD_hufCTablesMetadata_t *hufMetadata,void *workspace,size_t wkspSize,
                 int writeEntropy)

{
  uint uVar1;
  uint uVar2;
  uint *maxSymbolValuePtr;
  size_t sVar3;
  int *in_RCX;
  ulong in_RSI;
  HUF_CElt *in_R8;
  size_t cLitSizeEstimate;
  size_t largest;
  U32 singleStream;
  size_t literalSectionHeaderSize;
  uint maxSymbolValue;
  uint *countWksp;
  void *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar4;
  size_t local_8;
  
  uVar4 = 0xff;
  maxSymbolValuePtr = (uint *)(long)(int)((0x3ff < in_RSI) + 3 + (uint)(0x3fff < in_RSI));
  uVar1 = (uint)(in_RSI < 0x100);
  local_8 = in_RSI;
  if (*in_RCX != 0) {
    if (*in_RCX == 1) {
      local_8 = 1;
    }
    else {
      if ((*in_RCX != 2) && (*in_RCX != 3)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5f24,
                      "size_t ZSTD_estimateBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                     );
      }
      HIST_count_wksp((uint *)CONCAT44(0xff,in_stack_ffffffffffffffb8),maxSymbolValuePtr,
                      (void *)(ulong)CONCAT14(in_RSI < 0x100,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x2c19f8);
      uVar2 = ZSTD_isError(0x2c1a07);
      if (uVar2 == 0) {
        sVar3 = HUF_estimateCompressedSize
                          (in_R8,(uint *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),
                           (uint)((ulong)maxSymbolValuePtr >> 0x20));
        if ((int)largest != 0) {
          sVar3 = *(long *)(in_RCX + 0x22) + sVar3;
        }
        if (uVar1 == 0) {
          sVar3 = sVar3 + 6;
        }
        local_8 = sVar3 + (long)maxSymbolValuePtr;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t
ZSTD_estimateBlockSize_literal(const BYTE* literals, size_t litSize,
                               const ZSTD_hufCTables_t* huf,
                               const ZSTD_hufCTablesMetadata_t* hufMetadata,
                               void* workspace, size_t wkspSize,
                               int writeEntropy)
{
    unsigned* const countWksp = (unsigned*)workspace;
    unsigned maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    size_t literalSectionHeaderSize = 3 + (litSize >= 1 KB) + (litSize >= 16 KB);
    U32 singleStream = litSize < 256;

    if (hufMetadata->hType == set_basic) return litSize;
    else if (hufMetadata->hType == set_rle) return 1;
    else if (hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat) {
        size_t const largest = HIST_count_wksp (countWksp, &maxSymbolValue, (const BYTE*)literals, litSize, workspace, wkspSize);
        if (ZSTD_isError(largest)) return litSize;
        {   size_t cLitSizeEstimate = HUF_estimateCompressedSize((const HUF_CElt*)huf->CTable, countWksp, maxSymbolValue);
            if (writeEntropy) cLitSizeEstimate += hufMetadata->hufDesSize;
            if (!singleStream) cLitSizeEstimate += 6; /* multi-stream huffman uses 6-byte jump table */
            return cLitSizeEstimate + literalSectionHeaderSize;
    }   }
    assert(0); /* impossible */
    return 0;
}